

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O0

FileData * __thiscall GGSock::FileServer::getFileData(FileServer *this,TURI *uri)

{
  bool bVar1;
  pointer pIVar2;
  size_type sVar3;
  reference rVar4;
  int i;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  lock_guard<std::mutex> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar5;
  undefined4 in_stack_ffffffffffffffbc;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffc0;
  reference local_38;
  int local_24;
  reference local_8;
  
  std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
  operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_> *
             )0x13605d);
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  rVar4._M_mask = (_Bit_type)in_stack_ffffffffffffff98;
  rVar4._M_p = (_Bit_type *)in_stack_ffffffffffffffa0;
  local_24 = 0;
  do {
    iVar5 = local_24;
    pIVar2 = std::
             unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
             operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x13608b);
    sVar3 = std::vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
            ::size(&pIVar2->files);
    if ((int)sVar3 <= iVar5) {
      iVar5 = 0;
LAB_00136184:
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x13618e);
      if (iVar5 == 0) {
        if (getFileData(std::__cxx11::string_const&)::empty == '\0') {
          iVar5 = __cxa_guard_acquire(&getFileData(std::__cxx11::string_const&)::empty);
          if (iVar5 != 0) {
            FileData::FileData((FileData *)rVar4._M_p);
            __cxa_atexit(FileData::~FileData,&getFileData::empty,&__dso_handle);
            __cxa_guard_release(&getFileData(std::__cxx11::string_const&)::empty);
          }
        }
        local_8 = &getFileData::empty;
      }
      return local_8;
    }
    std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
    operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                *)0x1360b0);
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (in_stack_ffffffffffffffc0,
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    local_38 = rVar4;
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_38);
    if (bVar1) {
      pIVar2 = std::
               unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
               ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                             *)0x13611c);
      std::vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>::
      operator[](&pIVar2->files,(long)local_24);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              rVar4._M_p,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              rVar4._M_mask);
      if (!bVar1) {
        pIVar2 = std::
                 unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                 ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                               *)0x13614c);
        local_8 = std::
                  vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                  ::operator[](&pIVar2->files,(long)local_24);
        iVar5 = 1;
        goto LAB_00136184;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

const FileServer::FileData & FileServer::getFileData(const TURI & uri) const {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        for (int i = 0; i < (int) m_impl->files.size(); ++i) {
            if (m_impl->fileUsed[i] == false) {
                continue;
            }

            if (m_impl->files[i].info.uri != uri) {
                continue;
            }

            return m_impl->files[i];
        }
    }

    static FileData empty;
    return empty;
}